

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O0

bool __thiscall
iDynTree::KinDynComputations::getAverageVelocityJacobian
          (KinDynComputations *this,MatrixView<double> *avgVelocityJacobian)

{
  index_type iVar1;
  long lVar2;
  MatrixView<double> *in_RSI;
  long in_RDI;
  bool bVar3;
  Matrix6x6 invLockedInertia;
  SpatialInertia *lockedInertia;
  bool ok;
  DenseBase<Eigen::Product<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>_>
  *in_stack_fffffffffffffd18;
  MatrixView<double> *pMVar4;
  KinDynComputationsPrivateAttributes *in_stack_fffffffffffffd20;
  undefined7 in_stack_fffffffffffffd48;
  undefined1 uVar5;
  int in_stack_fffffffffffffd54;
  Index in_stack_fffffffffffffd58;
  Index in_stack_fffffffffffffd60;
  MatrixView<double> *in_stack_fffffffffffffd68;
  MatrixView<double> *in_stack_ffffffffffffffc8;
  KinDynComputationsPrivateAttributes *in_stack_ffffffffffffffd0;
  
  pMVar4 = in_RSI;
  iVar1 = MatrixView<double>::rows(in_RSI);
  uVar5 = false;
  if (iVar1 == 6) {
    iVar1 = MatrixView<double>::cols(pMVar4);
    lVar2 = iDynTree::Model::getNrOfDOFs();
    uVar5 = iVar1 == lVar2 + 6;
  }
  bVar3 = (bool)uVar5 != false;
  if (bVar3) {
    computeRawMassMatrixAndTotalMomentum((KinDynComputations *)in_RSI);
    KinDynComputationsPrivateAttributes::getRobotLockedInertia(in_stack_fffffffffffffd20);
    iDynTree::SpatialInertia::getInverse();
    toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)pMVar4);
    toEigen((MatrixDynSize *)CONCAT17(uVar5,in_stack_fffffffffffffd48));
    iDynTree::Model::getNrOfDOFs();
    Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>>::
    block<int,unsigned_long>
              ((DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                *)in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
               in_stack_fffffffffffffd54,CONCAT17(uVar5,in_stack_fffffffffffffd48));
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>>::operator*
              ((MatrixBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
                *)pMVar4,
               (MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>_>
                *)in_RSI);
    toEigen(in_stack_fffffffffffffd68);
    Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<-1,-1>>::operator=
              ((Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_> *)
               in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    pMVar4 = *(MatrixView<double> **)(in_RDI + 8);
    MatrixView<double>::MatrixView((MatrixView<double> *)in_stack_fffffffffffffd20,pMVar4);
    KinDynComputationsPrivateAttributes::processOnRightSideMatrixExpectingBodyFixedModelVelocity
              ((KinDynComputationsPrivateAttributes *)invLockedInertia.m_data[8],
               (MatrixView<double> *)invLockedInertia.m_data[7]);
    MatrixView<double>::MatrixView(*(MatrixView<double> **)(in_RDI + 8),pMVar4);
    KinDynComputationsPrivateAttributes::processOnLeftSideBodyFixedAvgVelocityJacobian
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  else {
    iDynTree::reportError
              ("KinDynComputations","getAverageVelocityJacobian",
               "Wrong size in input avgVelocityJacobian");
  }
  return bVar3;
}

Assistant:

bool KinDynComputations::getAverageVelocityJacobian(MatrixView<double> avgVelocityJacobian)
{
    bool ok = (avgVelocityJacobian.rows() == 6)
        && (avgVelocityJacobian.cols() == pimpl->m_robot_model.getNrOfDOFs() + 6);

    if( !ok )
    {
        reportError("KinDynComputations",
                    "getAverageVelocityJacobian",
                    "Wrong size in input avgVelocityJacobian");
        return false;
    }

    this->computeRawMassMatrixAndTotalMomentum();

    const SpatialInertia & lockedInertia = pimpl->getRobotLockedInertia();
    Matrix6x6 invLockedInertia = lockedInertia.getInverse();

    // The first six rows of the mass matrix are the base-base average velocity jacobian
    toEigen(avgVelocityJacobian) = toEigen(invLockedInertia)*toEigen(pimpl->m_rawMassMatrix).block(0,0,6,6+pimpl->m_robot_model.getNrOfDOFs());

    // Handle the different representations
    pimpl->processOnRightSideMatrixExpectingBodyFixedModelVelocity(avgVelocityJacobian);
    pimpl->processOnLeftSideBodyFixedAvgVelocityJacobian(avgVelocityJacobian);

    return true;
}